

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O1

void nonce_override_generate_nonce
               (uint8_t *nonce,uint8_t *message,size_t message_len,uint8_t *footer,size_t footer_len
               )

{
  undefined8 uVar1;
  undefined8 extraout_RDX;
  undefined1 auStack_200 [464];
  
  if ((nonce != (uint8_t *)0x0) && (message != (uint8_t *)0x0)) {
    if (override_enabled) {
      *(undefined8 *)(nonce + 0x10) = override_value._16_8_;
      uVar1 = override_value._8_8_;
      *(undefined8 *)nonce = override_value._0_8_;
      *(undefined8 *)(nonce + 8) = uVar1;
      return;
    }
    default_generate_nonce();
    return;
  }
  nonce_override_generate_nonce_cold_1();
  crypto_generichash_blake2b_init(auStack_200,nonce,0x18,0x18);
  crypto_generichash_blake2b_update(auStack_200,message,extraout_RDX);
  crypto_generichash_blake2b_final(auStack_200,nonce,0x18);
  return;
}

Assistant:

void nonce_override_generate_nonce(
        uint8_t nonce[paseto_v2_LOCAL_NONCEBYTES],
        const uint8_t *message, size_t message_len,
        const uint8_t *footer, size_t footer_len) {
    if (!nonce || !message) {
        fprintf(stderr, "generate_nonce called with null pointer");
        abort();
    }
    if (override_enabled) {
        memcpy(nonce, override_value, paseto_v2_LOCAL_NONCEBYTES);
    } else {
        default_generate_nonce(nonce, message, message_len, footer, footer_len);
    }
}